

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O3

void utext_setNativeIndex_63(UText *ut,int64_t index)

{
  int iVar1;
  
  if ((index < ut->chunkNativeStart) || (ut->chunkNativeLimit <= index)) {
    (*ut->pFuncs->access)(ut,index,'\x01');
    iVar1 = ut->chunkOffset;
  }
  else {
    iVar1 = (int)index - (int)ut->chunkNativeStart;
    if (ut->nativeIndexingLimit < iVar1) {
      iVar1 = (*ut->pFuncs->mapNativeIndexToUTF16)(ut,index);
    }
    ut->chunkOffset = iVar1;
  }
  if ((iVar1 < ut->chunkLength) && ((ut->chunkContents[iVar1] & 0xfc00U) == 0xdc00)) {
    if (iVar1 == 0) {
      (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0');
    }
    iVar1 = ut->chunkOffset;
    if ((0 < (long)iVar1) && ((ut->chunkContents[(long)iVar1 + -1] & 0xfc00U) == 0xd800)) {
      ut->chunkOffset = iVar1 + -1;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
utext_setNativeIndex(UText *ut, int64_t index) {
    if(index<ut->chunkNativeStart || index>=ut->chunkNativeLimit) {
        // The desired position is outside of the current chunk.
        // Access the new position.  Assume a forward iteration from here,
        // which will also be optimimum for a single random access.
        // Reverse iterations may suffer slightly.
        ut->pFuncs->access(ut, index, TRUE);
    } else if((int32_t)(index - ut->chunkNativeStart) <= ut->nativeIndexingLimit) {
        // utf-16 indexing.
        ut->chunkOffset=(int32_t)(index-ut->chunkNativeStart);
    } else {
         ut->chunkOffset=ut->pFuncs->mapNativeIndexToUTF16(ut, index);
    }
    // The convention is that the index must always be on a code point boundary.
    // Adjust the index position if it is in the middle of a surrogate pair.
    if (ut->chunkOffset<ut->chunkLength) {
        UChar c= ut->chunkContents[ut->chunkOffset];
        if (U16_IS_TRAIL(c)) {
            if (ut->chunkOffset==0) {
                ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE);
            }
            if (ut->chunkOffset>0) {
                UChar lead = ut->chunkContents[ut->chunkOffset-1];
                if (U16_IS_LEAD(lead)) {
                    ut->chunkOffset--;
                }
            }
        }
    }
}